

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KuhnAlgorithm.cpp
# Opt level: O0

int16_t __thiscall BoxNesting::KuhnAlgorithm::runAlgorithm(KuhnAlgorithm *this)

{
  _Bit_iterator __first;
  bool bVar1;
  short sVar2;
  reference pvVar3;
  uint uVar4;
  long in_RDI;
  bool bVar5;
  iterator iVar6;
  int16_t i_1;
  int16_t visibleBoxes;
  int16_t i;
  bool pathFound;
  byte local_81;
  undefined4 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff94;
  short sVar7;
  undefined2 in_stack_ffffffffffffff96;
  reference in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  short in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  int16_t vertex;
  undefined4 in_stack_ffffffffffffffbc;
  
  do {
    std::vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)0x133baf)
    ;
    iVar6 = std::vector<bool,_std::allocator<bool>_>::end
                      ((vector<bool,_std::allocator<bool>_> *)(in_RDI + 0x20));
    uVar4 = iVar6.super__Bit_iterator_base._M_offset;
    vertex = iVar6.super__Bit_iterator_base._M_p._6_2_;
    __first.super__Bit_iterator_base._8_6_ = (int6)iVar6.super__Bit_iterator_base._M_p;
    __first.super__Bit_iterator_base._M_p =
         (_Bit_type *)
         (ulong)CONCAT16(in_stack_ffffffffffffffae,
                         CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    __first.super__Bit_iterator_base._14_2_ = vertex;
    std::fill<std::_Bit_iterator,bool>
              (__first,(_Bit_iterator)in_stack_ffffffffffffff98,
               (bool *)CONCAT26(in_stack_ffffffffffffff96,
                                CONCAT24(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)));
    bVar5 = false;
    for (in_stack_ffffffffffffffac = 0; in_stack_ffffffffffffffac < *(short *)(in_RDI + 0x18);
        in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + 1) {
      pvVar3 = std::vector<short,_std::allocator<short>_>::operator[]
                         ((vector<short,_std::allocator<short>_> *)(in_RDI + 0x48),
                          (long)in_stack_ffffffffffffffac);
      local_81 = 0;
      if (*pvVar3 == -1) {
        in_stack_ffffffffffffff98 =
             std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff98._M_mask,
                        (size_type)in_stack_ffffffffffffff98._M_p);
        bVar1 = std::_Bit_reference::operator_cast_to_bool
                          ((_Bit_reference *)&stack0xffffffffffffff98);
        local_81 = bVar1 ^ 0xff;
      }
      if ((local_81 & 1) != 0) {
        bVar1 = kuhn((KuhnAlgorithm *)CONCAT44(in_stack_ffffffffffffffbc,uVar4),vertex);
        bVar5 = bVar5 || bVar1;
      }
    }
  } while (bVar5);
  sVar2 = *(short *)(in_RDI + 0x18);
  for (sVar7 = 0; sVar7 < *(short *)(in_RDI + 0x1a); sVar7 = sVar7 + 1) {
    pvVar3 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)(in_RDI + 0x60),(long)sVar7);
    if (*pvVar3 != -1) {
      sVar2 = sVar2 + -1;
    }
  }
  return sVar2;
}

Assistant:

int16_t KuhnAlgorithm::runAlgorithm() const
{
	bool pathFound;
	do {
		fill(this->used.begin(), this->used.end(), false);
		pathFound = false;
		// remember to start only from free vertices which are not visited yet
		for (int16_t i = 0; i < this->leftVerticesCount; ++i) {
			if (this->pairsLeft[i] == -1 && !this->used[i]) {
				pathFound |= kuhn(i);
			}
		}
	} while (pathFound);

	// We have the same amount of visible boxes as there
	// are vertices in the left part of the bipartite graph
	// for each valid match (i.e. a box can nest inside another box)
	// we remove a visible box
	int16_t visibleBoxes = this->leftVerticesCount;
	for (int16_t i = 0; i < this->rightVerticesCount; ++i) {
		if (this->pairsRight[i] != -1) {
			--visibleBoxes;
		}
	}

	return visibleBoxes;
}